

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O1

path * __thiscall
MPL::detail::ModelPackageImpl::getItemPath
          (path *__return_storage_ptr__,ModelPackageImpl *this,string *name,string *author)

{
  path local_60;
  path local_38;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_38,author,auto_format);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_60,name,auto_format);
  std::filesystem::__cxx11::operator/(__return_storage_ptr__,&local_38,&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::filesystem::path ModelPackageImpl::getItemPath(const std::string& name, const std::string& author) const {
    return std::filesystem::path(author) / name;
}